

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O3

Byte * z7_BranchConv_ARM64_Enc(Byte *data,SizeT size,UInt32 pc)

{
  uint uVar1;
  Byte *pBVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = size & 0xfffffffffffffffc;
  pBVar2 = data;
  if (uVar3 != 0) {
    pBVar2 = data + uVar3;
    uVar4 = 0;
    do {
      uVar5 = *(uint *)(data + uVar4);
      if ((uVar5 & 0xfc000000) == 0x94000000) {
        uVar5 = uVar5 + (pc + (int)uVar4 >> 2) & 0x3ffffff | 0x94000000;
LAB_0012f560:
        *(uint *)(data + uVar4) = uVar5;
      }
      else if (((uVar5 + 0x70000000 & 0x9f000000) == 0) &&
              (uVar1 = uVar5 + 0x70100000, (uVar1 & 0xe00000) == 0)) {
        uVar1 = (uVar1 >> 0x1a | uVar1 & 0xff1fffe0) + (pc + (int)uVar4 >> 0xc) * 8;
        uVar5 = (uVar1 & 0x1fffe0) + 0xf00000 & 0xffffe0 | uVar1 * 0x4000000 | uVar5 & 0x1f |
                0x90000000;
        goto LAB_0012f560;
      }
      uVar4 = uVar4 + 4;
    } while (uVar3 != uVar4);
  }
  return pBVar2;
}

Assistant:

Z7_BRANCH_FUNCS_IMP(BranchConv_ARM64)


Z7_BRANCH_FUNC_MAIN(BranchConv_ARM)
{
  // Byte *p = data;
  const Byte *lim;
  size &= ~(SizeT)3;
  lim = p + size;
  BR_PC_INIT
  /* in ARM: branch offset is relative to the +2 instructions from current instruction.
     (p) will point to next instruction */
  pc += 8 - 4;
  
  for (;;)
  {
    for (;;)
    {
      if Z7_UNLIKELY(p >= lim) { return p; }  p += 4;  if Z7_UNLIKELY(p[-1] == 0xeb) break;
      if Z7_UNLIKELY(p >= lim) { return p; }  p += 4;  if Z7_UNLIKELY(p[-1] == 0xeb) break;
    }
    {
      UInt32 v = GetUi32a(p - 4);
      UInt32 c = BR_PC_GET >> 2;
      BR_CONVERT_VAL(v, c)
      v &= 0x00ffffff;
      v |= 0xeb000000;
      SetUi32a(p - 4, v)
    }
  }
}